

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

CompileFlag __thiscall
hypermind::ASTBlock::compile(ASTBlock *this,Compiler *compiler,CompileFlag flag)

{
  CompileUnit *pCVar1;
  pointer psVar2;
  element_type *peVar3;
  CompileFlag CVar4;
  shared_ptr<hypermind::ASTNode> *stmt;
  pointer psVar5;
  
  CVar4 = Error;
  if (flag != Check) {
    pCVar1 = compiler->mCurCompileUnit;
    pCVar1->mLine = (this->super_ASTNode).line;
    pCVar1->mColumn = (this->super_ASTNode).column;
    psVar2 = (this->stmts).
             super__Vector_base<std::shared_ptr<hypermind::ASTNode>,_std::allocator<std::shared_ptr<hypermind::ASTNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    CVar4 = Null;
    for (psVar5 = (this->stmts).
                  super__Vector_base<std::shared_ptr<hypermind::ASTNode>,_std::allocator<std::shared_ptr<hypermind::ASTNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar2; psVar5 = psVar5 + 1)
    {
      peVar3 = (psVar5->super___shared_ptr<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*peVar3->_vptr_ASTNode[1])(peVar3,compiler,0);
    }
  }
  return CVar4;
}

Assistant:

AST_COMPILE(ASTBlock) {
        AST_ENTER();
        for (auto &stmt : stmts)
            stmt->compile(compiler);
        AST_LEAVE();
    }